

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

void framebuffer_size_callback(GLFWwindow *self,int width,int height)

{
  void *pvVar1;
  
  pvVar1 = glfwGetWindowUserPointer(self);
  *(ulong *)((long)pvVar1 + 0x10) = CONCAT44((float)height,(float)width);
  (*glad_glViewport)(0,0,width,height);
  return;
}

Assistant:

static void framebuffer_size_callback(GLFWwindow* self, int width, int height)
{
	bov_window_t* window = (bov_window_t*) glfwGetWindowUserPointer(self);
	window->param.res[0] = (GLfloat) width;
	window->param.res[1] = (GLfloat) height;
	glViewport(0, 0, width, height);
}